

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmake::EvaluateDefaultGlobalGenerator(cmake *this)

{
  ulong uVar1;
  cmake *in_RSI;
  unique_ptr<cmGlobalUnixMakefileGenerator3,_std::default_delete<cmGlobalUnixMakefileGenerator3>_>
  local_60 [3];
  allocator<char> local_41;
  string local_40;
  cmGlobalGenerator *local_20;
  cmGlobalGenerator *gen;
  cmake *this_local;
  
  this_local = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_20 = CreateGlobalGenerator(in_RSI,&in_RSI->EnvironmentGenerator);
    if (local_20 != (cmGlobalGenerator *)0x0) {
      std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
      unique_ptr<std::default_delete<cmGlobalGenerator>,void>
                ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)this,
                 local_20);
      return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>
             )(__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>
               )this;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "CMAKE_GENERATOR was set but the specified generator doesn\'t exist. Using CMake default."
               ,&local_41);
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  std::make_unique<cmGlobalUnixMakefileGenerator3,cmake*>((cmake **)local_60);
  std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
  unique_ptr<cmGlobalUnixMakefileGenerator3,std::default_delete<cmGlobalUnixMakefileGenerator3>,void>
            ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)this,local_60);
  std::
  unique_ptr<cmGlobalUnixMakefileGenerator3,_std::default_delete<cmGlobalUnixMakefileGenerator3>_>::
  ~unique_ptr(local_60);
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> cmake::EvaluateDefaultGlobalGenerator()
{
  if (!this->EnvironmentGenerator.empty()) {
    cmGlobalGenerator* gen =
      this->CreateGlobalGenerator(this->EnvironmentGenerator);
    if (!gen) {
      cmSystemTools::Error("CMAKE_GENERATOR was set but the specified "
                           "generator doesn't exist. Using CMake default.");
    } else {
      return std::unique_ptr<cmGlobalGenerator>(gen);
    }
  }
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
  std::string found;
  // Try to find the newest VS installed on the computer and
  // use that as a default if -G is not specified
  const std::string vsregBase = "HKEY_LOCAL_MACHINE\\SOFTWARE\\Microsoft\\";
  static const char* const vsVariants[] = {
    /* clang-format needs this comment to break after the opening brace */
    "VisualStudio\\", "VCExpress\\", "WDExpress\\"
  };
  struct VSVersionedGenerator
  {
    const char* MSVersion;
    const char* GeneratorName;
  };
  static VSVersionedGenerator const vsGenerators[] = {
    { "14.0", "Visual Studio 14 2015" }, //
    { "12.0", "Visual Studio 12 2013" }, //
    { "11.0", "Visual Studio 11 2012" }, //
    { "10.0", "Visual Studio 10 2010" }, //
    { "9.0", "Visual Studio 9 2008" }
  };
  static const char* const vsEntries[] = {
    "\\Setup\\VC;ProductDir", //
    ";InstallDir"             //
  };
  if (cmVSSetupAPIHelper(16).IsVSInstalled()) {
    found = "Visual Studio 16 2019";
  } else if (cmVSSetupAPIHelper(15).IsVSInstalled()) {
    found = "Visual Studio 15 2017";
  } else {
    for (VSVersionedGenerator const* g = cm::cbegin(vsGenerators);
         found.empty() && g != cm::cend(vsGenerators); ++g) {
      for (const char* const* v = cm::cbegin(vsVariants);
           found.empty() && v != cm::cend(vsVariants); ++v) {
        for (const char* const* e = cm::cbegin(vsEntries);
             found.empty() && e != cm::cend(vsEntries); ++e) {
          std::string const reg = vsregBase + *v + g->MSVersion + *e;
          std::string dir;
          if (cmSystemTools::ReadRegistryValue(reg, dir,
                                               cmSystemTools::KeyWOW64_32) &&
              cmSystemTools::PathExists(dir)) {
            found = g->GeneratorName;
          }
        }
      }
    }
  }
  cmGlobalGenerator* gen = this->CreateGlobalGenerator(found);
  if (!gen) {
    gen = new cmGlobalNMakeMakefileGenerator(this);
  }
  return std::unique_ptr<cmGlobalGenerator>(gen);
#else
  return cm::make_unique<cmGlobalUnixMakefileGenerator3>(this);
#endif
}